

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void in_memory_snapshot_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  __atomic_base<unsigned_long> _Var10;
  char *handle;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *doc_00;
  fdb_iterator *doc_01;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *in_RCX;
  fdb_kvs_handle *extraout_RDX;
  char *pcVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *doc_02;
  uint uVar15;
  __atomic_base<unsigned_long> unaff_RBP;
  __atomic_base<unsigned_long> _Var16;
  fdb_iterator *pfVar17;
  char *unaff_R12;
  char *unaff_R13;
  long lVar18;
  ulong uVar19;
  fdb_config *pfVar20;
  fdb_kvs_handle *unaff_R15;
  fdb_doc **ppfVar21;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_kvs_handle *snap_db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_doc *pfStack_17f0;
  fdb_iterator *pfStack_17e8;
  int iStack_17dc;
  fdb_kvs_handle *pfStack_17d8;
  timeval tStack_17d0;
  fdb_kvs_handle *pfStack_17c0;
  fdb_kvs_handle *pfStack_17b8;
  fdb_kvs_handle *pfStack_17b0;
  fdb_kvs_handle *pfStack_17a8;
  fdb_iterator *pfStack_17a0;
  fdb_iterator *pfStack_1798;
  fdb_kvs_handle *pfStack_1788;
  fdb_kvs_handle *pfStack_1780;
  undefined1 auStack_1778 [24];
  fdb_kvs_handle *pfStack_1760;
  fdb_kvs_handle *pfStack_1758;
  fdb_kvs_handle *pfStack_1750;
  fdb_kvs_handle *pfStack_1748;
  undefined1 auStack_1740 [80];
  undefined8 auStack_16f0 [5];
  fdb_doc *apfStack_16c8 [6];
  fdb_kvs_info fStack_1698;
  timeval tStack_1668;
  undefined1 auStack_1658 [280];
  fdb_iterator fStack_1540;
  fdb_kvs_handle fStack_1440;
  fdb_kvs_handle *pfStack_1238;
  fdb_kvs_handle *pfStack_1230;
  fdb_kvs_handle *pfStack_1228;
  code *pcStack_1220;
  fdb_kvs_handle *pfStack_1210;
  fdb_iterator *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  fdb_custom_cmp_variable *pp_Stack_11f0;
  size_t sStack_11e8;
  fdb_kvs_handle *pfStack_11e0;
  fdb_kvs_info fStack_11d8;
  undefined1 auStack_11a8 [10];
  undefined1 auStack_119e [14];
  undefined2 uStack_1190;
  fdb_encryption_key afStack_1098 [7];
  fdb_kvs_handle *pfStack_f90;
  fdb_kvs_handle *pfStack_f88;
  fdb_kvs_handle *pfStack_f80;
  fdb_kvs_handle *pfStack_f78;
  fdb_kvs_handle *pfStack_f70;
  fdb_kvs_handle *pfStack_f68;
  undefined1 auStack_f58 [8];
  fdb_file_handle *pfStack_f50;
  fdb_kvs_handle *pfStack_f48;
  fdb_kvs_handle *pfStack_f40;
  fdb_iterator *pfStack_f38;
  undefined1 auStack_f30 [48];
  undefined1 auStack_f00 [64];
  hbtrie *phStack_ec0;
  kvs_ops_stat *pkStack_eb8;
  timeval tStack_e90;
  btreeblk_handle *apbStack_e80 [33];
  undefined1 auStack_d78 [32];
  undefined2 uStack_d58;
  undefined1 uStack_d38;
  code *pcStack_d20;
  undefined4 uStack_d18;
  fdb_txn *pfStack_d10;
  fdb_kvs_handle *pfStack_c80;
  char acStack_c78 [256];
  fdb_kvs_handle *pfStack_b78;
  fdb_kvs_handle *pfStack_b70;
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b40;
  uint uStack_b34;
  fdb_iterator *pfStack_b30;
  fdb_kvs_handle *pfStack_b28;
  undefined4 *puStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_iterator *pfStack_b08;
  fdb_file_handle *pfStack_b00;
  fdb_iterator *pfStack_af8;
  size_t sStack_af0;
  undefined1 auStack_ae8 [32];
  timeval tStack_ac8;
  undefined1 auStack_ab8 [272];
  size_t sStack_9a8;
  char *pcStack_9a0;
  uint8_t uStack_998;
  undefined2 uStack_990;
  undefined1 uStack_970;
  fdb_kvs_handle *pfStack_8b8;
  char acStack_8b0 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_7b0;
  fdb_kvs_handle *pfStack_7a8;
  fdb_kvs_handle *pfStack_7a0;
  fdb_kvs_handle *pfStack_798;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  fdb_kvs_handle *pfStack_778;
  fdb_file_handle *pfStack_770;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_768;
  fdb_doc *pfStack_760;
  fdb_kvs_handle *pfStack_758;
  fdb_kvs_handle *pfStack_750;
  fdb_kvs_handle *pfStack_748;
  fdb_kvs_handle *pfStack_740;
  fdb_kvs_handle *pfStack_738;
  fdb_kvs_handle *pfStack_730;
  fdb_kvs_config fStack_728;
  fdb_kvs_config fStack_710;
  fdb_kvs_config fStack_6f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_6d0 [4];
  timeval tStack_6b0;
  fdb_config fStack_6a0;
  fdb_kvs_info *pfStack_588;
  atomic<unsigned_long> aStack_580;
  fdb_kvs_handle *pfStack_578;
  atomic<unsigned_long> aStack_570;
  fdb_kvs_handle *pfStack_568;
  atomic<unsigned_long> aStack_560;
  fdb_kvs_handle *local_550;
  fdb_kvs_handle *local_548;
  fdb_file_handle *local_540;
  undefined1 local_538 [16];
  fdb_config *local_528;
  fdb_kvs_info local_520;
  fdb_kvs_config local_4f0;
  undefined1 auStack_4d8 [176];
  char local_428 [256];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_104;
  undefined1 local_f9;
  
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae3;
  gettimeofday((timeval *)(auStack_4d8 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae8;
  memleak_start();
  pcVar13 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111af7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar20 = (fdb_config *)(local_328 + 0x200);
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b07;
  fdb_get_default_config();
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b11;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b36;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b4a;
  fVar4 = fdb_open(&local_540,"./mvcc_test1",pfVar20);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b66;
    fVar4 = fdb_kvs_open_default(local_540,&local_550,&local_4f0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011224b;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b7f;
    fVar4 = fdb_snapshot_open(local_550,&local_548,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112250;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b96;
    fdb_get_kvs_info(local_548,&local_520);
    if ((fdb_config *)local_520.last_seqnum != (fdb_config *)0x0) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ba6;
      in_memory_snapshot_test();
    }
    pcVar13 = local_538;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bc9;
    fdb_iterator_init(local_548,(fdb_iterator **)pcVar13,(void *)0x0,0,(void *)0x0,0,0);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bd6;
    fVar4 = fdb_iterator_get((fdb_iterator *)local_538._0_8_,(fdb_doc **)(local_538 + 8));
    _Var10._M_i = (__int_type)pfVar20;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112255;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111be9;
    fdb_iterator_close((fdb_iterator *)local_538._0_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf3;
    fdb_kvs_close(local_548);
    lVar18 = 0;
    uVar19 = 0;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c31;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      pcVar13 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c4d;
      sprintf(pcVar13,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c60;
      sVar7 = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c6b;
      sVar8 = strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c76;
      sVar9 = strlen(pcVar13);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c9b;
      fdb_doc_create((fdb_doc **)(auStack_4d8 + lVar18),local_428,sVar7,local_328,sVar8,pcVar13,
                     sVar9);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cad;
      fdb_set(local_550,*(fdb_doc **)(auStack_4d8 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 5);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ccd;
    fdb_commit(local_540,'\x01');
    uVar19 = 5;
    ppfVar21 = (fdb_doc **)(auStack_4d8 + 0x28);
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d13;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      pcVar13 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d2f;
      sprintf(pcVar13,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d37;
      sVar7 = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d42;
      sVar8 = strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d4d;
      sVar9 = strlen(pcVar13);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6d;
      fdb_doc_create(ppfVar21,local_428,sVar7,local_328,sVar8,pcVar13,sVar9);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d7a;
      fdb_set(local_550,*ppfVar21);
      uVar19 = uVar19 + 1;
      ppfVar21 = ppfVar21 + 1;
    } while (uVar19 != 9);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
    sprintf(local_428,"key%d",9);
    unaff_R15 = (fdb_kvs_handle *)local_328;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dc7;
    sprintf((char *)unaff_R15,"meta%d",9);
    unaff_R12 = local_328 + 0x100;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111de5;
    sprintf(unaff_R12,"Body%d",9);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111df5;
    unaff_R13 = (char *)strlen(local_428);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e00;
    unaff_RBP._M_i = strlen((char *)unaff_R15);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e0b;
    sVar7 = strlen(unaff_R12);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e26;
    in_RCX = unaff_R15;
    fdb_doc_create((fdb_doc **)(auStack_4d8 + 0x48),local_428,(size_t)unaff_R13,unaff_R15,
                   unaff_RBP._M_i,unaff_R12,sVar7);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e33;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3f;
    fdb_commit(local_540,'\0');
    **(undefined1 **)(auStack_4d8._72_8_ + 0x40) = 0x62;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e56;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    _Var10._M_i = *(fdb_seqnum_t *)(auStack_4d8._72_8_ + 0x28);
    pcVar13 = (char *)&local_520;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e6f;
    fdb_get_kvs_info(local_550,(fdb_kvs_info *)pcVar13);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e82;
    fVar4 = fdb_snapshot_open(local_550,&local_548,local_520.last_seqnum);
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011225a;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ea6;
    local_528 = (fdb_config *)_Var10._M_i;
    fVar4 = fdb_snapshot_open(local_550,&local_548,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011225f;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eba;
    fdb_commit(local_540,'\0');
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ecc;
    fdb_set(local_550,(fdb_doc *)auStack_4d8._72_8_);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed8;
    fdb_commit(local_540,'\0');
    uVar19 = 10;
    pcVar13 = (char *)0x50;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eff;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f1b;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      unaff_R12 = local_328 + 0x100;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f37;
      sprintf(unaff_R12,"body%d",uVar19 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_4d8 + (long)pcVar13);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4a;
      _Var10._M_i = strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f55;
      unaff_R13 = (char *)strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f60;
      sVar7 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)local_328;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f85;
      fdb_doc_create((fdb_doc **)unaff_RBP._M_i,local_428,_Var10._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar7);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f97;
      fdb_set(local_550,*(fdb_doc **)(auStack_4d8 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pcVar13 = (char *)((long)pcVar13 + 8);
    } while (uVar19 != 0xf);
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc0;
    fVar4 = fdb_set_log_callback(local_550,logCallbackFunc,"in_memory_snapshot_test");
    unaff_R15 = (fdb_kvs_handle *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112264;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_get_kvs_info(local_548,&local_520);
    if ((fdb_config *)local_520.last_seqnum != local_528) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fef;
      in_memory_snapshot_test();
    }
    uVar19 = 0xf;
    pfVar20 = (fdb_config *)(auStack_4d8 + 0x78);
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112017;
      sprintf(local_428,"key%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112032;
      sprintf(local_328,"meta%d",uVar19 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(local_328 + 0x100);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11204d;
      sprintf((char *)unaff_RBP._M_i,"body%d",uVar19 & 0xffffffff);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112055;
      unaff_R15 = (fdb_kvs_handle *)strlen(local_428);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112060;
      unaff_R12 = (char *)strlen(local_328);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206b;
      sVar7 = strlen((char *)unaff_RBP._M_i);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11208b;
      fdb_doc_create((fdb_doc **)pfVar20,local_428,(size_t)unaff_R15,local_328,(size_t)unaff_R12,
                     (void *)unaff_RBP._M_i,sVar7);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112098;
      fdb_set(local_550,*(fdb_doc **)pfVar20);
      uVar19 = uVar19 + 1;
      pfVar20 = (fdb_config *)((long)pfVar20 + 8);
    } while (uVar19 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120b8;
    fdb_commit(local_540,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120d8;
    fdb_iterator_init(local_548,(fdb_iterator **)local_538,(void *)0x0,0,(void *)0x0,0,0);
    pcVar13 = local_538 + 8;
    local_538._8_8_ = (fdb_config *)0x0;
    do {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120f1;
      fVar4 = fdb_iterator_get((fdb_iterator *)local_538._0_8_,(fdb_doc **)pcVar13);
      _Var10._M_i = local_538._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011222b:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112230;
        in_memory_snapshot_test();
LAB_00112230:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11223b;
        in_memory_snapshot_test();
LAB_0011223b:
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112246;
        in_memory_snapshot_test();
        goto LAB_00112246;
      }
      unaff_R15 = *(fdb_kvs_handle **)(local_538._8_8_ + 0x20);
      unaff_RBP._M_i = *(__int_type *)(auStack_4d8 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->op_stats;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11211c;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(size_t *)local_538._8_8_);
      pfVar20 = (fdb_config *)_Var10._M_i;
      if (iVar5 != 0) {
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222b;
        in_memory_snapshot_test();
        goto LAB_0011222b;
      }
      unaff_R15 = *(fdb_kvs_handle **)(_Var10._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->staletree;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11213b;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var10._M_i + 8));
      if (iVar5 != 0) goto LAB_0011223b;
      unaff_R15 = *(fdb_kvs_handle **)(_Var10._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_RBP._M_i)->field_6).seqtree;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215a;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var10._M_i + 0x10));
      if (iVar5 != 0) goto LAB_00112230;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216a;
      fdb_doc_free((fdb_doc *)_Var10._M_i);
      local_538._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112180;
      fVar4 = fdb_iterator_next((fdb_iterator *)local_538._0_8_);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11219d;
      fdb_iterator_close((fdb_iterator *)local_538._0_8_);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a7;
      fdb_kvs_close(local_550);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121b1;
      fdb_kvs_close(local_548);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121bb;
      fdb_close(local_540);
      lVar18 = 0;
      do {
        aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ca;
        fdb_doc_free(*(fdb_doc **)(auStack_4d8 + lVar18 * 8));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x14);
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121d8;
      fdb_shutdown();
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121dd;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11220e;
      fprintf(_stderr,pcVar13,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112246:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11224b;
    in_memory_snapshot_test();
LAB_0011224b:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112250;
    in_memory_snapshot_test();
LAB_00112250:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112255;
    in_memory_snapshot_test();
    _Var10._M_i = (__int_type)pfVar20;
LAB_00112255:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225a;
    in_memory_snapshot_test();
LAB_0011225a:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225f;
    in_memory_snapshot_test();
LAB_0011225f:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112264;
    in_memory_snapshot_test();
LAB_00112264:
    aStack_560.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112269;
    in_memory_snapshot_test();
  }
  aStack_560.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle = (char *)0x0;
  pfStack_788 = (fdb_kvs_handle *)0x112291;
  pfStack_588 = (fdb_kvs_info *)pcVar13;
  aStack_580.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_578 = (fdb_kvs_handle *)unaff_R13;
  aStack_570.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var10._M_i;
  pfStack_568 = unaff_R15;
  aStack_560.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_RBP._M_i;
  gettimeofday(&tStack_6b0,(__timezone_ptr_t)0x0);
  pfStack_788 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  aStack_768.seqtree = (btree *)0x0;
  pcVar13 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_788 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&fStack_6a0.seqtree_opt;
  pfStack_788 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_788 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  fStack_6a0.compaction_minimum_filesize = 0x400;
  fStack_6a0._68_4_ = 1;
  fStack_6a0.prefetch_duration._7_1_ = '\0';
  fStack_6a0.breakpad_minidump_dir = (char *)0x0;
  pfStack_788 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_788 = (fdb_kvs_handle *)0x1122fc;
  fVar4 = fdb_open(&pfStack_770,"./mvcc_test1",(fdb_config *)pfVar14);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_788 = (fdb_kvs_handle *)0x112318;
    fVar4 = fdb_kvs_open_default(pfStack_770,&pfStack_778,&fStack_728);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_788 = (fdb_kvs_handle *)0x112338;
    fVar4 = fdb_set_log_callback(pfStack_778,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar13 = (char *)aaStack_6d0;
    aaStack_6d0[0]._0_4_ = 0x79656b;
    pfVar14 = (fdb_kvs_handle *)&fStack_6f0;
    fStack_6f0._4_1_ = 0;
    fStack_6f0.create_if_missing = true;
    fStack_6f0._1_3_ = 0x617465;
    handle = &fStack_710.create_if_missing;
    fStack_710._4_1_ = 0;
    fStack_710.create_if_missing = true;
    fStack_710._1_3_ = 0x79646f;
    pfStack_788 = (fdb_kvs_handle *)0x11237b;
    unaff_R12 = (char *)strlen(pcVar13);
    pfStack_788 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar14);
    pfStack_788 = (fdb_kvs_handle *)0x112391;
    sVar7 = strlen(handle);
    unaff_RBP._M_i = (__int_type)&aStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x1123b1;
    in_RCX = pfVar14;
    fdb_doc_create((fdb_doc **)unaff_RBP._M_i,pcVar13,(size_t)unaff_R12,pfVar14,(size_t)unaff_R13,
                   handle,sVar7);
    pfStack_788 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    pfStack_788 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(pfStack_770,'\0');
    pfStack_788 = (fdb_kvs_handle *)0x1123e1;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_748,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_788 = (fdb_kvs_handle *)0x1123f8;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_788 = (fdb_kvs_handle *)0x11240c;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_788 = (fdb_kvs_handle *)0x11242a;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_750,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_788 = (fdb_kvs_handle *)0x112441;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_788 = (fdb_kvs_handle *)0x112455;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_788 = (fdb_kvs_handle *)0x11246c;
    fVar4 = fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_788 = (fdb_kvs_handle *)0x112480;
    fVar4 = fdb_commit(pfStack_770,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar13 = (char *)&aStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free((fdb_doc *)aStack_768.seqtree);
    pfVar14 = (fdb_kvs_handle *)&fStack_6a0;
    fStack_6a0.chunksize = 0x654b;
    fStack_6a0._2_2_ = 0x79;
    pfStack_788 = (fdb_kvs_handle *)0x1124ac;
    handle = (char *)strlen((char *)pfVar14);
    unaff_R12 = &fStack_6f0.create_if_missing;
    pfStack_788 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP._M_i = (__int_type)&fStack_710;
    pfStack_788 = (fdb_kvs_handle *)0x1124cf;
    sVar7 = strlen((char *)unaff_RBP._M_i);
    pfStack_788 = (fdb_kvs_handle *)0x1124ea;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar13,pfVar14,(size_t)handle,unaff_R12,(size_t)unaff_R13,
                   (void *)unaff_RBP._M_i,sVar7);
    pfStack_788 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(pfStack_778,(fdb_doc *)aStack_768.seqtree);
    pfStack_788 = (fdb_kvs_handle *)0x11250d;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_758,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar13 = (char *)aaStack_6d0;
    pfStack_788 = (fdb_kvs_handle *)0x112525;
    sVar7 = strlen(pcVar13);
    pfVar14 = (fdb_kvs_handle *)&pfStack_760;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_788 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar14,pcVar13,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_788 = (fdb_kvs_handle *)0x112555;
    fVar4 = fdb_get(pfStack_748,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_788 = (fdb_kvs_handle *)0x11256c;
    fVar4 = fdb_get(pfStack_750,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_788 = (fdb_kvs_handle *)0x112583;
    fVar4 = fdb_get(pfStack_758,pfStack_760);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_788 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(pfStack_760);
    pfStack_788 = (fdb_kvs_handle *)0x1125a9;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_730,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_788 = (fdb_kvs_handle *)0x1125c5;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_738,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_788 = (fdb_kvs_handle *)0x1125e1;
    fVar4 = fdb_snapshot_open(pfStack_778,&pfStack_740,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_788 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(pfStack_748);
    pfStack_788 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(pfStack_750);
    pfStack_788 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(pfStack_758);
    pfStack_788 = (fdb_kvs_handle *)0x112616;
    fVar4 = fdb_commit(pfStack_770,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_788 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(pfStack_730);
      pfStack_788 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(pfStack_738);
      pfStack_788 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(pfStack_740);
      pfStack_788 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(pfStack_778);
      pfStack_788 = (fdb_kvs_handle *)0x112650;
      fdb_close(pfStack_770);
      pfStack_788 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free((fdb_doc *)aStack_768.seqtree);
      pfStack_788 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_788 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_788 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar13,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_788 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_788 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_788 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_788 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_788 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_788 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_788 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_788 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_788 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_788 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_788 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_788 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_788 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_788 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_788 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_788 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_788 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_788 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_788 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_b50 = (fdb_kvs_handle *)0x112726;
  paStack_7b0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar13;
  pfStack_7a8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_7a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_798 = pfVar14;
  pfStack_790 = (fdb_kvs_handle *)handle;
  pfStack_788 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_ac8,(__timezone_ptr_t)0x0);
  pfStack_8b8 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_8b0,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_b50 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_8b8);
  pfStack_b50 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_b50 = (fdb_kvs_handle *)0x11275d;
  pfVar11 = (fdb_kvs_handle *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)(auStack_ab8 + 0x108);
  pfStack_b50 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_990._0_1_ = true;
  uStack_990._1_1_ = true;
  uStack_998 = '\x01';
  pcStack_9a0 = (char *)0x3c;
  uStack_970 = 1;
  sStack_9a8 = 0;
  pfStack_b50 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_b50 = (fdb_kvs_handle *)0x1127af;
  fVar4 = fdb_open(&pfStack_b00,"./mvcc_test",(fdb_config *)pfVar14);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fd5;
  in_RCX = (fdb_kvs_handle *)(auStack_ae8 + 8);
  pfStack_b50 = (fdb_kvs_handle *)0x1127d2;
  fVar4 = fdb_kvs_open(pfStack_b00,&pfStack_b18,"db",(fdb_kvs_config *)in_RCX);
  pcVar13 = (char *)pfVar14;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
  puStack_b20 = (undefined4 *)((long)&pfVar11->kvs + 2);
  pcVar13 = "k%05d";
  handle = auStack_ab8;
  unaff_R12 = "value%08d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_b50 = (fdb_kvs_handle *)0x11280d;
    sprintf(handle,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar11->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x11283b;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    unaff_R13 = (char *)pfStack_b18;
    pfStack_b50 = (fdb_kvs_handle *)0x112848;
    sVar7 = strlen(handle);
    pfStack_b50 = (fdb_kvs_handle *)0x112860;
    in_RCX = pfVar11;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar11,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 0x1e);
  pfStack_b50 = (fdb_kvs_handle *)0x11287e;
  fVar4 = fdb_commit(pfStack_b00,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
  pfStack_b50 = (fdb_kvs_handle *)0x11289c;
  fVar4 = fdb_snapshot_open(pfStack_b18,&pfStack_b28,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
  pfStack_b50 = (fdb_kvs_handle *)0x1128ba;
  fVar4 = fdb_snapshot_open(pfStack_b28,&pfStack_b10,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
  unaff_RBP._M_i = 0x1e;
  pcVar13 = "k%05d";
  handle = auStack_ab8;
  unaff_R12 = "value%08d";
  do {
    pfStack_b50 = (fdb_kvs_handle *)0x1128ec;
    sprintf(handle,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar11->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x11291a;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    unaff_R13 = (char *)pfStack_b18;
    pfStack_b50 = (fdb_kvs_handle *)0x112927;
    sVar7 = strlen(handle);
    pfStack_b50 = (fdb_kvs_handle *)0x11293f;
    in_RCX = pfVar11;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar11,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 300);
  pfStack_b50 = (fdb_kvs_handle *)0x11296f;
  sprintf((char *)auStack_ab8,"k%05d",0x1e);
  handle = (char *)pfStack_b28;
  pfStack_b50 = (fdb_kvs_handle *)0x11297c;
  sVar7 = strlen((char *)auStack_ab8);
  in_RCX = (fdb_kvs_handle *)auStack_ae8;
  pfStack_b50 = (fdb_kvs_handle *)0x112995;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_ab8,sVar7 + 1,
                     (void **)in_RCX,&sStack_af0);
  pcVar13 = (char *)pfStack_b10;
  pfVar14 = (fdb_kvs_handle *)auStack_ab8;
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
  handle = auStack_ab8;
  pfStack_b50 = (fdb_kvs_handle *)0x1129b2;
  sVar7 = strlen(handle);
  in_RCX = (fdb_kvs_handle *)auStack_ae8;
  pfStack_b50 = (fdb_kvs_handle *)0x1129cb;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)pcVar13,handle,sVar7 + 1,(void **)in_RCX,&sStack_af0);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
  pfStack_b50 = (fdb_kvs_handle *)0x1129dd;
  fVar4 = fdb_kvs_close(pfStack_b28);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
  pfStack_b50 = (fdb_kvs_handle *)0x1129ef;
  fVar4 = fdb_kvs_close(pfStack_b10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
  pfStack_b50 = (fdb_kvs_handle *)0x112a0d;
  fVar4 = fdb_snapshot_open(pfStack_b18,&pfStack_b28,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113002;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112a35;
  fVar4 = fdb_iterator_init(pfStack_b28,&pfStack_b30,(void *)0x0,0,(void *)0x0,0,0);
  pfVar14 = (fdb_kvs_handle *)pcVar13;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113007;
  unaff_R12 = auStack_ab8;
  unaff_R13 = "value%08d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112a66;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    pfVar14 = (fdb_kvs_handle *)pcVar13;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_b50 = (fdb_kvs_handle *)0x112a81;
    sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar11->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112aaf;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    pcVar13 = (char *)pfStack_b40;
    handle = (char *)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112ac6;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00112f5a;
    handle = (char *)(((fdb_kvs_handle *)pcVar13)->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112ae1;
    iVar5 = bcmp(handle,pfVar11,(size_t)(((fdb_kvs_handle *)pcVar13)->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112f6a;
    unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
    pfStack_b50 = (fdb_kvs_handle *)0x112af3;
    fdb_doc_free((fdb_doc *)pcVar13);
    pfStack_b50 = (fdb_kvs_handle *)0x112afd;
    fVar4 = fdb_iterator_next(pfStack_b30);
    pfVar14 = (fdb_kvs_handle *)pcVar13;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP._M_i != 300) goto LAB_0011300c;
  pfStack_b50 = (fdb_kvs_handle *)0x112b1b;
  fVar4 = fdb_iterator_close(pfStack_b30);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113011;
  pfStack_b50 = (fdb_kvs_handle *)0x112b39;
  fVar4 = fdb_snapshot_open(pfStack_b28,&pfStack_b10,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113016;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112b61;
  fVar4 = fdb_iterator_init(pfStack_b28,&pfStack_b30,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112b89;
  fVar4 = fdb_iterator_init(pfStack_b10,&pfStack_af8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113020;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112bb1;
  fVar4 = fdb_iterator_init(pfStack_b18,&pfStack_b08,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113025;
  unaff_R12 = auStack_ab8;
  unaff_R13 = "value%08d";
  handle = "k%06d";
  uStack_b34 = 0;
  do {
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112bef;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    uVar15 = uStack_b34;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_b50 = (fdb_kvs_handle *)0x112c0e;
    sprintf(unaff_R12,"k%05d",(ulong)uStack_b34);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar11->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112c3c;
    sprintf((char *)pfVar11,"value%08d",(ulong)uVar15);
    pcVar13 = (char *)pfStack_b40;
    unaff_RBP._M_i = (__int_type)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112c53;
    iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00112f75;
    unaff_RBP._M_i = (__int_type)(((fdb_kvs_handle *)pcVar13)->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112c6e;
    iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar11,
                 (size_t)(((fdb_kvs_handle *)pcVar13)->kvs_config).custom_cmp_param);
    pfVar14 = (fdb_kvs_handle *)pcVar13;
    if (iVar5 != 0) goto LAB_00112fa5;
    pfStack_b50 = (fdb_kvs_handle *)0x112c7e;
    fdb_doc_free((fdb_doc *)pcVar13);
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112c96;
    fVar4 = fdb_iterator_get(pfStack_b30,(fdb_doc **)&pfStack_b40);
    pfVar14 = pfStack_b40;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
    unaff_RBP._M_i = (__int_type)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112cb5;
    iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00112f8a;
    unaff_RBP._M_i = (__int_type)(pfVar14->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112cd0;
    iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar11,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112f9a;
    uVar15 = uStack_b34 + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
    pfStack_b50 = (fdb_kvs_handle *)0x112ce6;
    fdb_doc_free((fdb_doc *)pfVar14);
    uStack_b34 = uVar15;
    if (uVar15 == 0x3c) {
      pcVar13 = (char *)0x0;
      do {
        pfStack_b50 = (fdb_kvs_handle *)0x112d02;
        sprintf(unaff_R12,"k%06d",pcVar13);
        *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar11->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
        *(undefined2 *)(puStack_b20 + 1) = 0x3e;
        *puStack_b20 = 0x646e653c;
        pfStack_b50 = (fdb_kvs_handle *)0x112d31;
        sprintf((char *)pfVar11,"value%08d",pcVar13);
        unaff_RBP._M_i = (__int_type)pfStack_b18;
        pfStack_b50 = (fdb_kvs_handle *)0x112d3e;
        sVar7 = strlen(unaff_R12);
        pfStack_b50 = (fdb_kvs_handle *)0x112d56;
        in_RCX = pfVar11;
        fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_RBP._M_i,unaff_R12,sVar7 + 1,pfVar11,0x20);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_b50 = (fdb_kvs_handle *)0x112f50;
          in_memory_snapshot_on_dirty_hbtrie_test();
          goto LAB_00112f50;
        }
        uVar15 = (int)pcVar13 + 1;
        pcVar13 = (char *)(ulong)uVar15;
      } while (uVar15 != 3000);
    }
    pfStack_b50 = (fdb_kvs_handle *)0x112d74;
    fVar4 = fdb_iterator_next(pfStack_b30);
    pfVar14 = (fdb_kvs_handle *)(ulong)(uint)fVar4;
    pfStack_b50 = (fdb_kvs_handle *)0x112d81;
    fVar6 = fdb_iterator_next(pfStack_af8);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
    }
    else if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (uStack_b34 != 300) goto LAB_0011302a;
  pfStack_b50 = (fdb_kvs_handle *)0x112db8;
  fVar4 = fdb_iterator_close(pfStack_b30);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
  pfStack_b50 = (fdb_kvs_handle *)0x112dca;
  fVar4 = fdb_iterator_close(pfStack_af8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113034;
  unaff_R12 = auStack_ab8;
  unaff_R13 = "value%08d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_b40 = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112dfb;
    fVar4 = fdb_iterator_get(pfStack_b08,(fdb_doc **)&pfStack_b40);
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_b50 = (fdb_kvs_handle *)0x112e16;
    sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar11->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_b20 + 1) = 0x3e;
    *puStack_b20 = 0x646e653c;
    pfStack_b50 = (fdb_kvs_handle *)0x112e44;
    sprintf((char *)pfVar11,"value%08d",unaff_RBP._M_i);
    pfVar14 = pfStack_b40;
    handle = (char *)pfStack_b40->op_stats;
    pfStack_b50 = (fdb_kvs_handle *)0x112e5b;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_b40->kvs_config);
    if (iVar5 != 0) goto LAB_00112fb0;
    handle = (char *)(pfVar14->field_6).seqtree;
    pfStack_b50 = (fdb_kvs_handle *)0x112e76;
    iVar5 = bcmp(handle,pfVar11,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112fc0;
    unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
    pfStack_b50 = (fdb_kvs_handle *)0x112e88;
    fdb_doc_free((fdb_doc *)pfVar14);
    pfStack_b50 = (fdb_kvs_handle *)0x112e92;
    fVar4 = fdb_iterator_next(pfStack_b08);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP._M_i != 300) goto LAB_00113039;
  pfStack_b50 = (fdb_kvs_handle *)0x112eb0;
  fVar4 = fdb_iterator_close(pfStack_b08);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
  pfStack_b50 = (fdb_kvs_handle *)0x112ec2;
  fVar4 = fdb_kvs_close(pfStack_b28);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113043;
  pfStack_b50 = (fdb_kvs_handle *)0x112ed4;
  fVar4 = fdb_kvs_close(pfStack_b10);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113048;
  pfStack_b50 = (fdb_kvs_handle *)0x112ee6;
  fVar4 = fdb_close(pfStack_b00);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
  pfStack_b50 = (fdb_kvs_handle *)0x112ef3;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_b50 = (fdb_kvs_handle *)0x112f03;
    free(pfVar11);
    pfStack_b50 = (fdb_kvs_handle *)0x112f08;
    memleak_end();
    pcVar13 = "%s PASSED\n";
    if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
      pcVar13 = "%s FAILED\n";
    }
    pfStack_b50 = (fdb_kvs_handle *)0x112f39;
    fprintf(_stderr,pcVar13,"in-memory snapshot on dirty HB+trie nodes test");
    return;
  }
  goto LAB_00113052;
LAB_0011350e:
  pfStack_f68 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_f68 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_f68 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_f68 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_1220 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_1220 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_1220 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar14 = (fdb_kvs_handle *)afStack_1098;
  unaff_R12 = auStack_119e + 6;
  pcStack_1220 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_1798 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar12 = pfVar11;
LAB_00114575:
  pfVar11 = pfVar12;
  pfStack_1798 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_1798 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar14 = (fdb_kvs_handle *)&pfStack_1780;
  pfStack_1798 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00112f50:
  pfStack_b50 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_b50 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_b50 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_b50 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_b50 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar14 = (fdb_kvs_handle *)pcVar13;
  pfStack_b50 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_b50 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_b50 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_b50 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_b50 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_b50 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_b50 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_b50 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd5:
  pfStack_b50 = (fdb_kvs_handle *)0x112fda;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pcVar13 = (char *)pfVar14;
LAB_00112fda:
  pfStack_b50 = (fdb_kvs_handle *)0x112fdf;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
  pfStack_b50 = (fdb_kvs_handle *)0x112fe4;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
  pfStack_b50 = (fdb_kvs_handle *)0x112fe9;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
  pfStack_b50 = (fdb_kvs_handle *)0x112fee;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar14 = (fdb_kvs_handle *)pcVar13;
LAB_00112fee:
  pcVar13 = (char *)pfVar14;
  pfStack_b50 = (fdb_kvs_handle *)0x112ff3;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
  pfStack_b50 = (fdb_kvs_handle *)0x112ff8;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
  pfStack_b50 = (fdb_kvs_handle *)0x112ffd;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
  pfStack_b50 = (fdb_kvs_handle *)0x113002;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
  pfStack_b50 = (fdb_kvs_handle *)0x113007;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar14 = (fdb_kvs_handle *)pcVar13;
LAB_00113007:
  pfStack_b50 = (fdb_kvs_handle *)0x11300c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
  pfStack_b50 = (fdb_kvs_handle *)0x113011;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
  pfStack_b50 = (fdb_kvs_handle *)0x113016;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
  pfStack_b50 = (fdb_kvs_handle *)0x11301b;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
  pfStack_b50 = (fdb_kvs_handle *)0x113020;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
  pfStack_b50 = (fdb_kvs_handle *)0x113025;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
  pfStack_b50 = (fdb_kvs_handle *)0x11302a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
  pfStack_b50 = (fdb_kvs_handle *)0x11302f;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
  pfStack_b50 = (fdb_kvs_handle *)0x113034;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
  pfStack_b50 = (fdb_kvs_handle *)0x113039;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
  pfStack_b50 = (fdb_kvs_handle *)0x11303e;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
  pfStack_b50 = (fdb_kvs_handle *)0x113043;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
  pfStack_b50 = (fdb_kvs_handle *)0x113048;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
  pfStack_b50 = (fdb_kvs_handle *)0x11304d;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
  pfStack_b50 = (fdb_kvs_handle *)0x113052;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113052:
  pfStack_b50 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_f68 = (fdb_kvs_handle *)0x113077;
  pfStack_b78 = pfVar11;
  pfStack_b70 = (fdb_kvs_handle *)unaff_R12;
  pfStack_b68 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b60 = pfVar14;
  pfStack_b58 = (fdb_kvs_handle *)handle;
  pfStack_b50 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_e90,(__timezone_ptr_t)0x0);
  auStack_f58._4_2_ = 100;
  auStack_f58._0_4_ = 0x3530256b;
  auStack_f30._8_2_ = 100;
  auStack_f30._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_c78,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_c80 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_f68 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_c80);
  pfStack_f68 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_f68 = (fdb_kvs_handle *)0x1130d3;
  pfVar11 = (fdb_kvs_handle *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)((long)apbStack_e80 + 0x108);
  pfStack_f68 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_d58 = 0x201;
  auStack_d78[0x18] = '\x01';
  auStack_d78._16_8_ = (fdb_txn *)0x2;
  uStack_d38 = 1;
  auStack_d78._8_8_ = (fdb_log_callback)0x0;
  pcStack_d20 = cb_inmem_snap;
  uStack_d18 = 2;
  pfStack_d10 = (fdb_txn *)auStack_f00;
  pfStack_f68 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_f68 = (fdb_kvs_handle *)0x113144;
  fVar4 = fdb_open(&pfStack_f50,"./mvcc_test",(fdb_config *)pfVar14);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_f00 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x11316a;
    fVar4 = fdb_kvs_open(pfStack_f50,(fdb_kvs_handle **)(auStack_f30 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    in_RCX = (fdb_kvs_handle *)(auStack_f00 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x113190;
    fVar4 = fdb_kvs_open(pfStack_f50,(fdb_kvs_handle **)(auStack_f30 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_f00._0_8_ = auStack_f30._24_8_;
    auStack_f00._8_8_ = (btree *)0xa;
    auStack_f00._24_8_ = auStack_f58;
    handle = auStack_f30;
    auStack_f00._16_4_ = 0x20;
    pfVar14 = (fdb_kvs_handle *)((long)&pfVar11->kvs + 2);
    unaff_R12 = (char *)apbStack_e80;
    unaff_RBP._M_i = 0;
    auStack_f00._32_8_ = handle;
    do {
      pfStack_f68 = (fdb_kvs_handle *)0x1131ec;
      sprintf(unaff_R12,auStack_f58,unaff_RBP._M_i);
      *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar11->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar11->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
      pfStack_f68 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar11,handle,unaff_RBP._M_i);
      unaff_R13 = (char *)auStack_f30._16_8_;
      pfStack_f68 = (fdb_kvs_handle *)0x113224;
      sVar7 = strlen(unaff_R12);
      pfStack_f68 = (fdb_kvs_handle *)0x11323c;
      in_RCX = pfVar11;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar7 + 1,pfVar11,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_f68 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 10);
    pfStack_f68 = (fdb_kvs_handle *)0x11325a;
    fVar4 = fdb_commit(pfStack_f50,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_f68 = (fdb_kvs_handle *)0x113273;
    fVar4 = fdb_compact(pfStack_f50,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_f68 = (fdb_kvs_handle *)0x113291;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_f30._16_8_,&pfStack_f40,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_f68 = (fdb_kvs_handle *)0x1132ab;
    fVar4 = fdb_get_kvs_info(pfStack_f40,(fdb_kvs_info *)&phStack_ec0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_eb8 != (kvs_ops_stat *)0xb) {
      pfStack_f68 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f68 = (fdb_kvs_handle *)0x1132eb;
    fVar4 = fdb_iterator_init(pfStack_f40,&pfStack_f38,(void *)0x0,0,(void *)0x0,0,0);
    doc_00 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle = (char *)apbStack_e80;
    unaff_RBP._M_i = 0;
    do {
      pfStack_f48 = (fdb_kvs_handle *)0x0;
      pfStack_f68 = (fdb_kvs_handle *)0x113315;
      fVar4 = fdb_iterator_get(pfStack_f38,(fdb_doc **)&pfStack_f48);
      unaff_R13 = (char *)pfStack_f48;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP._M_i < 10) {
        pfStack_f68 = (fdb_kvs_handle *)0x113333;
        sprintf(handle,auStack_f58,unaff_RBP._M_i);
        *(undefined4 *)&pfVar11->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar11->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar11->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar11->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar11->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar11->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
        pfStack_f68 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar11,auStack_f30,unaff_RBP._M_i);
        unaff_R13 = (char *)pfStack_f48;
        unaff_R12 = (char *)pfStack_f48->op_stats;
        pfStack_f68 = (fdb_kvs_handle *)0x113378;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_f48->kvs_config);
        if (iVar5 != 0) goto LAB_00113529;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_f68 = (fdb_kvs_handle *)0x113393;
        iVar5 = bcmp(unaff_R12,pfVar11,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113539;
      }
      else {
        apbStack_e80[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_doc **)&pfVar11->kvs_config = (fdb_doc *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar11->kvs_config).custom_cmp = 0x65;
        unaff_R12 = (char *)pfStack_f48->op_stats;
        pfStack_f68 = (fdb_kvs_handle *)0x1133d9;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_f48->kvs_config);
        if (iVar5 != 0) goto LAB_0011350e;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_f68 = (fdb_kvs_handle *)0x1133f4;
        iVar5 = bcmp(unaff_R12,pfVar11,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011351e;
      }
      unaff_RBP._M_i = (__int_type)((uint)unaff_RBP._M_i + 1);
      pfStack_f68 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_f48);
      pfStack_f68 = (fdb_kvs_handle *)0x113412;
      fVar4 = fdb_iterator_next(pfStack_f38);
      doc_00 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 0xb) goto LAB_0011356c;
    pfStack_f68 = (fdb_kvs_handle *)0x11342d;
    fVar4 = fdb_iterator_close(pfStack_f38);
    _Var10._M_i = (__int_type)pfStack_f40;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle = (char *)apbStack_e80;
    pfStack_f68 = (fdb_kvs_handle *)0x11344a;
    sVar7 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_f30 + 0x28);
    pfStack_f68 = (fdb_kvs_handle *)0x113463;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)_Var10._M_i,handle,sVar7 + 1,(void **)in_RCX,
                       (size_t *)(auStack_f30 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_f68 = (fdb_kvs_handle *)0x113480;
    _Var16._M_i = (__int_type)pfVar11;
    iVar5 = bcmp((void *)auStack_f30._40_8_,pfVar11,auStack_f30._32_8_);
    _Var10._M_i = auStack_f30._40_8_;
    if (iVar5 != 0) goto LAB_0011357b;
    pfStack_f68 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_f30._40_8_);
    pfStack_f68 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_f40);
    pfStack_f68 = (fdb_kvs_handle *)0x1134a4;
    fVar4 = fdb_close(pfStack_f50);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_f68 = (fdb_kvs_handle *)0x1134b1;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_f68 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar11);
      pfStack_f68 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_f68 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar13,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_f68 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_f68 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_f68 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_f68 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_f68 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_f68 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_f68 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    doc_00 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_f68 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_f68 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    _Var10._M_i = (__int_type)pfVar14;
    pfStack_f68 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_f68 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_f68 = (fdb_kvs_handle *)0x113586;
    _Var16._M_i = _Var10._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_f68 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_f68 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar19 = _Var16._M_i & 0xffffffff;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pcStack_1220 = (code *)0x1135b8;
  pfStack_f90 = pfVar11;
  pfStack_f88 = (fdb_kvs_handle *)unaff_R12;
  pfStack_f80 = doc_00;
  pfStack_f78 = (fdb_kvs_handle *)_Var10._M_i;
  pfStack_f70 = (fdb_kvs_handle *)handle;
  pfStack_f68 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)auStack_11a8,(__timezone_ptr_t)0x0);
  if ((int)_Var16._M_i != 2) {
    return;
  }
  pfVar11 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_1220 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_1220 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_1220 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_1220 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_1220 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_1220 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_1220 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar12 = pfVar11;
LAB_00113afb:
    pcStack_1220 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar11 = in_RCX;
    pcStack_1220 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_1220 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar11 = (fdb_kvs_handle *)
              CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
    pfVar14 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(pfVar11->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar11->kvs_config).custom_cmp + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_1220 = (code *)0x113607;
      fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar11->kvs_config,&pfStack_1200,
                                0xffffffffffffffff);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_1220 = (code *)0x11361e;
      fVar4 = fdb_get_kvs_info(pfStack_1200,&fStack_11d8);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
      if (fStack_11d8.last_seqnum != (long)*(int *)&(pfVar11->kvs_config).custom_cmp) {
        pcStack_1220 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_1220 = (code *)0x113663;
      pfStack_11f8 = pfVar14;
      pp_Stack_11f0 = (fdb_custom_cmp_variable *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_1200,&pfStack_1208,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar11 = (fdb_kvs_handle *)(auStack_11a8 + 10);
        pcVar13 = auStack_119e + 6;
        uVar19 = 0;
        do {
          pfStack_1210 = (fdb_kvs_handle *)0x0;
          pcStack_1220 = (code *)0x11369a;
          fVar4 = fdb_iterator_get(pfStack_1208,(fdb_doc **)&pfStack_1210);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar18 = CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
          pcStack_1220 = (code *)0x1136ba;
          sprintf((char *)afStack_1098,*(char **)(lVar18 + 0x18),uVar19);
          sVar7 = (size_t)*(int *)(lVar18 + 0x10);
          pcStack_1220 = (code *)0x1136ce;
          memset(pcVar13,0x78,sVar7);
          *(undefined4 *)(&(pfVar11->kvs_config).create_if_missing + sVar7) = 0x646e653c;
          *(undefined2 *)(auStack_119e + sVar7 + 4) = 0x3e;
          pcStack_1220 = (code *)0x1136ee;
          sprintf(pcVar13,*(char **)(lVar18 + 0x20),uVar19);
          doc_00 = pfStack_1210;
          in_RCX = (fdb_kvs_handle *)pfStack_1210->op_stats;
          pcStack_1220 = (code *)0x113706;
          iVar5 = bcmp(in_RCX,afStack_1098,*(size_t *)&pfStack_1210->kvs_config);
          if (iVar5 != 0) {
            pcStack_1220 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_1220 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (fdb_kvs_handle *)(doc_00->field_6).seqtree;
          pcStack_1220 = (code *)0x113721;
          iVar5 = bcmp(in_RCX,pcVar13,(size_t)(doc_00->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113a88;
          uVar19 = (ulong)((int)uVar19 + 1);
          pcStack_1220 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)doc_00);
          pcStack_1220 = (code *)0x11373d;
          fVar4 = fdb_iterator_next(pfStack_1208);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar19 != *(int *)pp_Stack_11f0) {
          pcStack_1220 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_1220 = (code *)0x11375c;
        fVar4 = fdb_iterator_close(pfStack_1208);
        pfVar14 = pfStack_11f8;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_1220 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_11f8 = pfVar14;
    in_RCX = (fdb_kvs_handle *)afStack_1098;
    afStack_1098[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_1098[0].algorithm,"key",4);
    doc_00 = (fdb_kvs_handle *)(auStack_119e + 6);
    auStack_119e._6_8_ = 0x756c61765f77656e;
    uStack_1190 = 0x65;
    pfVar14 = *(fdb_kvs_handle **)&pfVar11->kvs_config;
    pcStack_1220 = (code *)0x1137b0;
    sVar7 = strlen((char *)in_RCX);
    unaff_R12 = (char *)(sVar7 + 1);
    pcStack_1220 = (code *)0x1137bc;
    sVar7 = strlen((char *)doc_00);
    pcStack_1220 = (code *)0x1137d1;
    fVar4 = fdb_set_kv(pfVar14,in_RCX,(size_t)unaff_R12,doc_00,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_1220 = (code *)0x1137ed;
    fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar11->kvs_config,&pfStack_1200,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_1220 = (code *)0x113804;
    fVar4 = fdb_get_kvs_info(pfStack_1200,&fStack_11d8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
    if (fStack_11d8.last_seqnum != (long)*(int *)&(pfVar11->kvs_config).custom_cmp + 1U) {
      pcStack_1220 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_1220 = (code *)0x113842;
    fVar4 = fdb_iterator_init(pfStack_1200,&pfStack_1208,(void *)0x0,0,(void *)0x0,0,0);
    pfVar12 = pfVar11;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    unaff_R12 = auStack_119e + 6;
    uVar19 = 0;
    do {
      pfStack_1210 = (fdb_kvs_handle *)0x0;
      pcStack_1220 = (code *)0x113874;
      fVar4 = fdb_iterator_get(pfStack_1208,(fdb_doc **)&pfStack_1210);
      pfVar11 = pfStack_1210;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar19 < *(int *)in_RCX) {
        lVar18 = CONCAT26(auStack_f58._6_2_,CONCAT24(auStack_f58._4_2_,auStack_f58._0_4_));
        pcStack_1220 = (code *)0x11389c;
        sprintf((char *)afStack_1098,*(char **)(lVar18 + 0x18),uVar19);
        sVar7 = (size_t)*(int *)(lVar18 + 0x10);
        pcStack_1220 = (code *)0x1138b0;
        memset(unaff_R12,0x78,sVar7);
        *(undefined4 *)(auStack_11a8 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_119e + sVar7 + 4) = 0x3e;
        pcStack_1220 = (code *)0x1138d5;
        sprintf(unaff_R12,*(char **)(lVar18 + 0x20),uVar19);
        pfVar11 = pfStack_1210;
        doc_00 = (fdb_kvs_handle *)pfStack_1210->op_stats;
        pcStack_1220 = (code *)0x1138ec;
        iVar5 = bcmp(doc_00,afStack_1098,*(size_t *)&pfStack_1210->kvs_config);
        if (iVar5 != 0) goto LAB_00113aa8;
        doc_00 = (fdb_kvs_handle *)(pfVar11->field_6).seqtree;
        pcStack_1220 = (code *)0x113907;
        iVar5 = bcmp(doc_00,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_1098[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_1098[0].algorithm,"key",4);
        auStack_119e._6_8_ = 0x756c61765f77656e;
        uStack_1190 = 0x65;
        doc_00 = (fdb_kvs_handle *)pfStack_1210->op_stats;
        pcStack_1220 = (code *)0x113955;
        iVar5 = bcmp(doc_00,afStack_1098,*(size_t *)&pfStack_1210->kvs_config);
        if (iVar5 != 0) goto LAB_00113ac8;
        doc_00 = (fdb_kvs_handle *)(pfVar11->field_6).seqtree;
        pcStack_1220 = (code *)0x113970;
        iVar5 = bcmp(doc_00,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113a98;
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      pcStack_1220 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_1210);
      pcStack_1220 = (code *)0x11398e;
      fVar4 = fdb_iterator_next(pfStack_1208);
      pfVar12 = pfVar11;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar19 != *(int *)in_RCX + 1) {
      pcStack_1220 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_1220 = (code *)0x1139ac;
    fVar4 = fdb_iterator_close(pfStack_1208);
    pfVar14 = pfStack_11f8;
    pfVar11 = pfStack_1200;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar12 = (fdb_kvs_handle *)afStack_1098;
    pcStack_1220 = (code *)0x1139ce;
    sVar7 = strlen((char *)pfVar12);
    pcStack_1220 = (code *)0x1139e7;
    fVar4 = fdb_get_kv(pfVar11,pfVar12,sVar7 + 1,&pfStack_11e0,&sStack_11e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_1220 = (code *)0x113a09;
    iVar5 = bcmp(pfStack_11e0,auStack_119e + 6,sStack_11e8);
    pfVar11 = pfStack_11e0;
    if (iVar5 == 0) {
      pcStack_1220 = (code *)0x113a19;
      fdb_free_block(pfStack_11e0);
LAB_00113a19:
      pcStack_1220 = (code *)0x113a23;
      fdb_kvs_close(pfStack_1200);
      return;
    }
  }
  pcStack_1220 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1798 = (fdb_iterator *)0x113b3a;
  fStack_1440.bub_ctx.space_used = (uint64_t)pfVar11;
  fStack_1440.bub_ctx.handle = (fdb_kvs_handle *)unaff_R12;
  pfStack_1238 = doc_00;
  pfStack_1230 = pfVar12;
  pfStack_1228 = pfVar14;
  pcStack_1220 = (code *)uVar19;
  gettimeofday(&tStack_1668,(__timezone_ptr_t)0x0);
  pfStack_1798 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_1798 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_kvs_handle *)&fStack_1440.config.encryption_key;
  pfStack_1798 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1658;
  pfStack_1798 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_1440.config.encryption_key.bytes[4] = '\0';
  fStack_1440.config.encryption_key.bytes[5] = '\0';
  fStack_1440.config.encryption_key.bytes[6] = '\0';
  fStack_1440.config.encryption_key.bytes[7] = '\0';
  fStack_1440.config.encryption_key.bytes[8] = '\0';
  fStack_1440.config.encryption_key.bytes[9] = '\0';
  fStack_1440.config.encryption_key.bytes[10] = '\0';
  fStack_1440.config.encryption_key.bytes[0xb] = '\0';
  fStack_1440.config.encryption_key.bytes[0xc] = '\0';
  fStack_1440.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1440.config.encryption_key.bytes[0xe] = '\0';
  fStack_1440.config.encryption_key.bytes[0xf] = '\0';
  fStack_1440.config.encryption_key.bytes[0x10] = '\0';
  fStack_1440.config.encryption_key.bytes[0x11] = '\0';
  fStack_1440.config.encryption_key.bytes[0x12] = '\0';
  fStack_1440.config.encryption_key.bytes[0x13] = '\0';
  fStack_1440.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1440.config._180_4_ = 1;
  fStack_1440.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1798 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)(auStack_1778 + 0x10);
  pfStack_1798 = (fdb_iterator *)0x113baf;
  fVar4 = fdb_open((fdb_file_handle **)pfVar14,"./mvcc_test1",(fdb_config *)pfVar11);
  doc_01 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1798 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1778._16_8_,&pfStack_1788,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1798 = (fdb_iterator *)0x113bda;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_1798 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1778._8_8_,(fdb_kvs_info *)(apfStack_16c8 + 6));
    if ((fdb_kvs_handle *)fStack_1698.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1798 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar14 = (fdb_kvs_handle *)auStack_1778;
    pfStack_1798 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1778._8_8_,(fdb_iterator **)pfVar14,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1798 = (fdb_iterator *)0x113c32;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
    pfVar12 = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_1798 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
    pfStack_1798 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1778._8_8_);
    lVar18 = 0;
    uVar19 = 0;
    do {
      pfStack_1798 = (fdb_iterator *)0x113c71;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_1440,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113cb9;
      sVar7 = strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x113cc4;
      sVar8 = strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x113ccf;
      sVar9 = strlen((char *)&fStack_1440);
      pfStack_1798 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_1740 + lVar18),auStack_1658 + 0x18,sVar7,&fStack_1540,
                     sVar8,&fStack_1440,sVar9);
      pfStack_1798 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_1788,*(fdb_doc **)(auStack_1740 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 5);
    pfStack_1798 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\x01');
    uVar19 = 5;
    ppfVar21 = (fdb_doc **)(auStack_1740 + 0x28);
    do {
      pfStack_1798 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_1440,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113d8a;
      sVar7 = strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x113d95;
      sVar8 = strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x113da0;
      sVar9 = strlen((char *)&fStack_1440);
      pfStack_1798 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(ppfVar21,auStack_1658 + 0x18,sVar7,&fStack_1540,sVar8,&fStack_1440,sVar9);
      pfStack_1798 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_1788,*ppfVar21);
      uVar19 = uVar19 + 1;
      ppfVar21 = ppfVar21 + 1;
    } while (uVar19 != 9);
    pfVar11 = (fdb_kvs_handle *)(auStack_1658 + 0x18);
    pfStack_1798 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar11,"key%d",9);
    config = &fStack_1540;
    pfStack_1798 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar12 = &fStack_1440;
    pfStack_1798 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar12,"Body%d",9);
    pfVar14 = (fdb_kvs_handle *)(auStack_1740 + 0x48);
    pfStack_1798 = (fdb_iterator *)0x113e48;
    doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar11);
    pfStack_1798 = (fdb_iterator *)0x113e53;
    doc_01 = (fdb_iterator *)strlen((char *)config);
    pfStack_1798 = (fdb_iterator *)0x113e5e;
    sVar7 = strlen((char *)pfVar12);
    pfStack_1798 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar14,pfVar11,(size_t)doc_00,config,(size_t)doc_01,pfVar12,sVar7);
    pfStack_1798 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    **(undefined1 **)(auStack_1740._72_8_ + 0x40) = 0x62;
    pfStack_1798 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    pfStack_1758 = *(fdb_kvs_handle **)(auStack_1740._72_8_ + 0x28);
    pfStack_1798 = (fdb_iterator *)0x113ed7;
    fVar4 = fdb_snapshot_open(pfStack_1788,&pfStack_1748,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_1798 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_1788,(fdb_doc *)auStack_1740._72_8_);
    pfStack_1798 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    uVar19 = 10;
    pfVar14 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1798 = (fdb_iterator *)0x113f24;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_1540,"meta%d",uVar19 & 0xffffffff);
      pfVar12 = &fStack_1440;
      pfStack_1798 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar12,"body%d",uVar19 & 0xffffffff);
      doc_01 = (fdb_iterator *)(auStack_1740 + (long)pfVar14);
      pfStack_1798 = (fdb_iterator *)0x113f6c;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x113f77;
      doc_00 = (fdb_kvs_handle *)strlen((char *)&fStack_1540);
      pfStack_1798 = (fdb_iterator *)0x113f82;
      sVar7 = strlen((char *)pfVar12);
      pfStack_1798 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_01,auStack_1658 + 0x18,(size_t)pfVar11,&fStack_1540,
                     (size_t)doc_00,pfVar12,sVar7);
      pfStack_1798 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_1788,*(fdb_doc **)(auStack_1740 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar19 != 0xf);
    pfStack_1798 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\x01');
    pfStack_1798 = (fdb_iterator *)0x113fee;
    fVar4 = fdb_set_log_callback(pfStack_1788,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_1798 = (fdb_iterator *)0x11400a;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),999999);
    pfVar11 = pfStack_1758;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_1798 = (fdb_iterator *)0x11402a;
    fVar4 = fdb_snapshot_open(pfStack_1788,(fdb_kvs_handle **)(auStack_1778 + 8),
                              (fdb_seqnum_t)pfStack_1758);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_1798 = (fdb_iterator *)0x114044;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1778._8_8_,&pfStack_1760,
                              (fdb_seqnum_t)pfVar11);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_1798 = (fdb_iterator *)0x114056;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1778._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_1798 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_1760,(fdb_kvs_info *)(apfStack_16c8 + 6));
    if ((fdb_kvs_handle *)fStack_1698.last_seqnum != pfVar11) {
      pfStack_1798 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar19 = 0xf;
    config = (fdb_iterator *)apfStack_16c8;
    do {
      pfStack_1798 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_1658 + 0x18,"key%d",uVar19 & 0xffffffff);
      doc_01 = &fStack_1540;
      pfStack_1798 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_01,"meta%d",uVar19 & 0xffffffff);
      pfVar11 = &fStack_1440;
      pfStack_1798 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar11,"body%d",uVar19 & 0xffffffff);
      pfStack_1798 = (fdb_iterator *)0x1140ef;
      pfVar12 = (fdb_kvs_handle *)strlen(auStack_1658 + 0x18);
      pfStack_1798 = (fdb_iterator *)0x1140fa;
      doc_00 = (fdb_kvs_handle *)strlen((char *)doc_01);
      pfStack_1798 = (fdb_iterator *)0x114105;
      sVar7 = strlen((char *)pfVar11);
      pfStack_1798 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_1658 + 0x18,(size_t)pfVar12,doc_01,(size_t)doc_00,
                     pfVar11,sVar7);
      pfStack_1798 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_1788,*(fdb_doc **)config);
      uVar19 = uVar19 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar19 != 0x14);
    pfStack_1798 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_1778._16_8_,'\0');
    pfStack_1798 = (fdb_iterator *)0x114165;
    fVar4 = fdb_snapshot_open(pfStack_1748,&pfStack_1750,0xffffffffffffffff);
    pfVar14 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar14 = (fdb_kvs_handle *)&pfStack_1780;
    pfStack_1798 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar14,
                   (void *)(*(size_t **)
                             (auStack_1740 + (((long)pfStack_1758 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_1740 + (((long)pfStack_1758 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1798 = (fdb_iterator *)0x1141bd;
    fVar4 = fdb_get_metaonly(pfStack_1760,(fdb_doc *)pfStack_1780);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_1798 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_1780);
    pfStack_1798 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_1780,*(kvs_ops_stat **)(auStack_1740._40_8_ + 0x20),
                   (size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_1740._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1798 = (fdb_iterator *)0x114204;
    fVar4 = fdb_get_metaonly(pfStack_1760,(fdb_doc *)pfStack_1780);
    unaff_R12 = (char *)auStack_1740._40_8_;
    doc_02 = pfStack_1780;
    pfVar14 = (fdb_kvs_handle *)&pfStack_1780;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar11 = (fdb_kvs_handle *)pfStack_1780->op_stats;
    config = *(fdb_iterator **)(auStack_1740._40_8_ + 0x20);
    pfStack_1798 = (fdb_iterator *)0x11422e;
    iVar5 = bcmp(pfVar11,config,(size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_1740._40_8_);
    if (iVar5 != 0) goto LAB_001145cc;
    pfVar11 = (fdb_kvs_handle *)doc_02->staletree;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_1798 = (fdb_iterator *)0x11424f;
    iVar5 = bcmp(pfVar11,config,(size_t)((fdb_kvs_config *)unaff_R12)->custom_cmp);
    if (iVar5 != 0) goto LAB_001145d7;
    pfStack_1798 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_02);
    pfStack_1798 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_1780,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1780->fhandle = (fdb_file_handle *)0x6;
    pfStack_1798 = (fdb_iterator *)0x114295;
    fVar4 = fdb_get_byseq(pfStack_1760,(fdb_doc *)pfStack_1780);
    pfVar14 = pfStack_1780;
    doc_02 = (fdb_kvs_handle *)&pfStack_1780;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar11 = (fdb_kvs_handle *)pfStack_1780->op_stats;
    config = *(fdb_iterator **)(auStack_1740._40_8_ + 0x20);
    pfStack_1798 = (fdb_iterator *)0x1142be;
    iVar5 = bcmp(pfVar11,config,*(size_t *)&pfStack_1780->kvs_config);
    unaff_R12 = (char *)auStack_1740._40_8_;
    if (iVar5 != 0) goto LAB_001145e7;
    pfVar11 = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1740._40_8_ + 0x40))->
             seqtree;
    pfStack_1798 = (fdb_iterator *)0x1142de;
    iVar5 = bcmp(pfVar11,config,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001145f2;
    pfStack_1798 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar14);
    pfVar14 = (fdb_kvs_handle *)&pfStack_1780;
    pfStack_1780 = (fdb_kvs_handle *)0x0;
    doc_00 = (fdb_kvs_handle *)0x0;
    pfStack_1798 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_1760,(fdb_iterator **)auStack_1778,(void *)0x0,0,(void *)0x0,0,0);
    pfVar12 = pfVar11;
    do {
      pfStack_1798 = (fdb_iterator *)0x11432a;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1778._0_8_,(fdb_doc **)pfVar14);
      pfVar11 = pfStack_1780;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_1798 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar11 = pfVar12;
LAB_00114554:
        pfStack_1798 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_1798 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config = (fdb_iterator *)pfStack_1780->op_stats;
      doc_01 = *(fdb_iterator **)(auStack_1740 + (long)doc_00 * 8);
      unaff_R12 = (char *)doc_01->_seqnum;
      pfStack_1798 = (fdb_iterator *)0x114352;
      iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1780->kvs_config);
      pfVar12 = pfVar11;
      if (iVar5 != 0) {
        pfStack_1798 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)pfVar11->staletree;
      unaff_R12 = (char *)doc_01->tree_cursor_start;
      pfStack_1798 = (fdb_iterator *)0x114371;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0011455f;
      config = (fdb_iterator *)(pfVar11->field_6).seqtree;
      unaff_R12 = (char *)doc_01->tree_cursor_prev;
      pfStack_1798 = (fdb_iterator *)0x114390;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00114554;
      pfStack_1798 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_1780 = (fdb_kvs_handle *)0x0;
      doc_00 = (fdb_kvs_handle *)&(doc_00->kvs_config).field_0x1;
      pfStack_1798 = (fdb_iterator *)0x1143b6;
      pfVar17 = (fdb_iterator *)auStack_1778._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)doc_00 == 10) {
      pfStack_1798 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
      doc_00 = (fdb_kvs_handle *)0x0;
      pfStack_1798 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_1750,(fdb_iterator **)auStack_1778,(void *)0x0,0,(void *)0x0,0,0);
      pfVar14 = (fdb_kvs_handle *)&pfStack_1780;
      do {
        pfStack_1798 = (fdb_iterator *)0x114408;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1778._0_8_,(fdb_doc **)pfVar14);
        pfVar11 = pfStack_1780;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config = (fdb_iterator *)pfStack_1780->op_stats;
        doc_01 = *(fdb_iterator **)(auStack_1740 + (long)doc_00 * 8);
        unaff_R12 = (char *)doc_01->_seqnum;
        pfStack_1798 = (fdb_iterator *)0x114430;
        iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1780->kvs_config);
        if (iVar5 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)pfVar11->staletree;
        unaff_R12 = (char *)doc_01->tree_cursor_start;
        pfStack_1798 = (fdb_iterator *)0x11444f;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_00114585;
        config = (fdb_iterator *)(pfVar11->field_6).seqtree;
        unaff_R12 = (char *)doc_01->tree_cursor_prev;
        pfStack_1798 = (fdb_iterator *)0x11446e;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011457a;
        pfStack_1798 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar11);
        pfStack_1780 = (fdb_kvs_handle *)0x0;
        doc_00 = (fdb_kvs_handle *)&(doc_00->kvs_config).field_0x1;
        pfStack_1798 = (fdb_iterator *)0x114494;
        pfVar17 = (fdb_iterator *)auStack_1778._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1778._0_8_);
        pfVar12 = pfVar11;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)doc_00 == 10) {
        pfStack_1798 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_1778._0_8_);
        pfStack_1798 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_1788);
        pfStack_1798 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_1748);
        pfStack_1798 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_1750);
        pfStack_1798 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_1760);
        pfStack_1798 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_1778._16_8_);
        lVar18 = 0;
        do {
          pfStack_1798 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_1740 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x14);
        pfStack_1798 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_1798 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        pfStack_1798 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar13,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_1798 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_1798 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar12 = (fdb_kvs_handle *)unaff_R12;
LAB_0011459a:
    pfStack_1798 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_1798 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_1798 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_1798 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_1798 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_1798 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_1798 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_1798 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_1798 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = (char *)pfVar12;
    doc_02 = pfVar14;
    pfStack_1798 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_1798 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_1798 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar14 = doc_02;
    pfStack_1798 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_1798 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_1798 = (fdb_iterator *)0x1145fd;
    pfVar17 = config;
    snapshot_clone_test();
  }
  pfStack_1798 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_1798 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_17f0 = (fdb_doc *)0x0;
  pfVar12 = pfVar17->handle;
  iVar5 = *(int *)&pfVar17->seqtree_iterator;
  pfStack_17c0 = pfVar14;
  pfStack_17b8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_17b0 = doc_00;
  pfStack_17a8 = pfVar11;
  pfStack_17a0 = config;
  pfStack_1798 = doc_01;
  gettimeofday(&tStack_17d0,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar17->hbtrie_iterator,&pfStack_17d8,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar18 = 0;
  iStack_17dc = iVar5;
  fdb_iterator_init(pfStack_17d8,&pfStack_17e8,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_17e8,&pfStack_17f0);
    doc = pfStack_17f0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_17f0->key;
    lVar2 = *(long *)(&(pfVar12->kvs_config).create_if_missing + lVar18 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_17f0->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_17f0 = (fdb_doc *)0x0;
    lVar18 = lVar18 + 1;
    fVar4 = fdb_iterator_next(pfStack_17e8);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_17dc / 2 == (int)lVar18) {
    fdb_iterator_close(pfStack_17e8);
    fdb_kvs_close(pfStack_17d8);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a snapshot from an empty database file
    status = fdb_snapshot_open(db, &snap_db, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check if snapshot's sequence number is zero.
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == 0);
    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    // Iterator should not return any items.
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);

    // ------- Setup test ----------------------------------
    // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 8
    for (; i < n/2 - 1; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // We want to create:
    // |WALFlushHDR|Key-Value1|HDR|Key-Value2|SnapshotHDR|Key-Value1|HDR|
    // Insert doc 9 with a different value to test duplicate elimination..
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "Body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Insert doc 9 now again with expected value..
    *(char *)doc[i]->body = 'b';
    fdb_set(db, doc[i]);

    // TAKE SNAPSHOT: pick up sequence number of a commit without a WAL flush
    snap_seq = doc[i]->seqnum;

    // Creation of a snapshot with a sequence number that was taken WITHOUT a
    // commit must fail even if it from the latest document that was set...
    fdb_get_kvs_info(db, &kvs_info);
    status = fdb_snapshot_open(db, &snap_db, kvs_info.last_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // ---------- Snapshot tests begin -----------------------
    // Initialize an in-memory snapshot Without a Commit...
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit again without a WAL flush (these documents go into the AVL trees)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Now re-insert doc 9 as another duplicate (only newer sequence number)
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (++i; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without a WAL flush (This WAL must not affect snapshot)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // repeat until fail
    i=0;
    count=0;
    rdoc = NULL;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n/2); // Only unique items from the first half

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot test");
}